

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.h
# Opt level: O0

void __thiscall
slang::parsing::ParserMetadata::ParserMetadata(ParserMetadata *this,ParserMetadata *param_1)

{
  undefined1 uVar1;
  NumericTokenFlags NVar2;
  uint32_t uVar3;
  ParserMetadata *param_1_local;
  ParserMetadata *this_local;
  
  ska::
  flat_hash_map<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>
  ::flat_hash_map(&this->nodeMap,&param_1->nodeMap);
  ska::
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::flat_hash_set(&this->globalInstances,&param_1->globalInstances);
  std::
  vector<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
  ::vector(&this->classPackageNames,&param_1->classPackageNames);
  std::
  vector<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
  ::vector(&this->packageImports,&param_1->packageImports);
  std::
  vector<const_slang::syntax::DefParamSyntax_*,_std::allocator<const_slang::syntax::DefParamSyntax_*>_>
  ::vector(&this->defparams,&param_1->defparams);
  std::
  vector<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
  ::vector(&this->classDecls,&param_1->classDecls);
  std::
  vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>
  ::vector(&this->bindDirectives,&param_1->bindDirectives);
  uVar1 = (param_1->eofToken).field_0x2;
  NVar2.raw = (param_1->eofToken).numFlags.raw;
  uVar3 = (param_1->eofToken).rawLen;
  (this->eofToken).kind = (param_1->eofToken).kind;
  (this->eofToken).field_0x2 = uVar1;
  (this->eofToken).numFlags = (NumericTokenFlags)NVar2.raw;
  (this->eofToken).rawLen = uVar3;
  (this->eofToken).info = (param_1->eofToken).info;
  return;
}

Assistant:

struct SLANG_EXPORT ParserMetadata {
    /// Collection of metadata that can be associated with a syntax node at parse time.
    struct Node {
        TokenKind defaultNetType;
        TokenKind unconnectedDrive;
        std::optional<TimeScale> timeScale;
    };

    /// Specific metadata that was in effect when certain syntax nodes were parsed
    /// (such as various bits of preprocessor state).
    flat_hash_map<const syntax::SyntaxNode*, Node> nodeMap;

    /// A set of names of all instantiations of global modules/interfaces/programs.
    /// This can be used to determine which modules should be considered as top-level
    /// roots of the design.
    flat_hash_set<string_view> globalInstances;

    /// A list of all names parsed that could represent a package or class name,
    /// since they are simple names that appear on the left-hand side of a double colon.
    std::vector<const syntax::IdentifierNameSyntax*> classPackageNames;

    /// A list of all package import declarations parsed.
    std::vector<const syntax::PackageImportDeclarationSyntax*> packageImports;

    /// A list of all defparams parsed.
    std::vector<const syntax::DefParamSyntax*> defparams;

    /// A list of all class declarations parsed.
    std::vector<const syntax::ClassDeclarationSyntax*> classDecls;

    /// A list of all bind directives parsed.
    std::vector<const syntax::BindDirectiveSyntax*> bindDirectives;

    /// The EOF token, if one has already been consumed by the parser.
    /// Otherwise an empty token.
    Token eofToken;

    /// Constructs a new set of parser metadata by walking the provided syntax tree.
    static ParserMetadata fromSyntax(const syntax::SyntaxNode& root);
}